

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O2

cmUVProcessChainBuilder * __thiscall
cmUVProcessChainBuilder::SetExternalStream(cmUVProcessChainBuilder *this,Stream stdio,FILE *stream)

{
  int iVar1;
  
  iVar1 = cm_fileno(stream);
  if (iVar1 < 0) {
    if (stdio < (Stream_ERROR|Stream_OUTPUT)) {
      (this->Stdio)._M_elems[stdio].Type = None;
    }
  }
  else if (stdio < (Stream_ERROR|Stream_OUTPUT)) {
    (this->Stdio)._M_elems[stdio].Type = External;
    (this->Stdio)._M_elems[stdio].FileDescriptor = iVar1;
  }
  return this;
}

Assistant:

cmUVProcessChainBuilder& cmUVProcessChainBuilder::SetExternalStream(
  Stream stdio, FILE* stream)
{
  int fd = cm_fileno(stream);
  if (fd >= 0) {
    return this->SetExternalStream(stdio, fd);
  }
  return this->SetNoStream(stdio);
}